

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O0

size_t fiobj_hash_update_json(FIOBJ hash,void *data,size_t len)

{
  size_t consumed;
  fiobj_json_parser_s p;
  size_t len_local;
  void *data_local;
  FIOBJ hash_local;
  
  if (hash == 0) {
    hash_local = 0;
  }
  else {
    p._64_8_ = len;
    memset(&consumed,0,0x48);
    p.top = hash;
    hash_local = fio_json_parse((json_parser_s *)&consumed,(char *)data,p._64_8_);
    fio_json_stack_free((fio_json_stack_s *)&p.target);
    fiobj_free((FIOBJ)p.p);
    if (p.key != hash) {
      fiobj_free(p.key);
    }
  }
  return hash_local;
}

Assistant:

size_t fiobj_hash_update_json(FIOBJ hash, const void *data, size_t len) {
  if (!hash)
    return 0;
  fiobj_json_parser_s p = {.top = FIOBJ_INVALID, .target = hash};
  size_t consumed = fio_json_parse(&p.p, data, len);
  fio_json_stack_free(&p.stack);
  fiobj_free(p.key);
  if (p.top != hash)
    fiobj_free(p.top);
  return consumed;
}